

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_lock.cpp
# Opt level: O1

bool mpp_spinlock_trylock(spinlock_t *lock)

{
  RK_S64 RVar1;
  RK_S64 RVar2;
  bool bVar3;
  
  if (lock->debug == 0) {
    RVar1 = 0;
  }
  else {
    RVar1 = mpp_time();
  }
  LOCK();
  bVar3 = lock->lock == 0;
  if (bVar3) {
    lock->lock = 1;
  }
  UNLOCK();
  if ((bVar3) && (RVar1 != 0 && lock->debug != 0)) {
    RVar2 = mpp_time();
    lock->time = lock->time + (RVar2 - RVar1);
    lock->count = lock->count + 1;
  }
  return bVar3;
}

Assistant:

bool mpp_spinlock_trylock(spinlock_t *lock)
{
    RK_S64 time = 0;
    bool ret;

    if (lock->debug)
        time = mpp_time();

    ret = MPP_BOOL_CAS(&lock->lock, LOCK_IDLE, LOCK_BUSY);

    if (ret && lock->debug && time) {
        lock->time += mpp_time() - time;
        lock->count++;
    }

    return ret;
}